

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O0

gdImagePtr gdImageCreateFromTgaPtr(int size,void *data)

{
  gdIOCtx *ctx;
  gdIOCtx *in;
  gdImagePtr im;
  void *data_local;
  gdImagePtr pgStack_10;
  int size_local;
  
  ctx = gdNewDynamicCtxEx(size,data,0);
  if (ctx == (gdIOCtx *)0x0) {
    pgStack_10 = (gdImagePtr)0x0;
  }
  else {
    pgStack_10 = gdImageCreateFromTgaCtx(ctx);
    (*ctx->gd_free)(ctx);
  }
  return pgStack_10;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromTgaPtr(int size, void *data)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewDynamicCtxEx (size, data, 0);
	if (in == NULL) return NULL;
	im = gdImageCreateFromTgaCtx(in);
	in->gd_free(in);
	return im;
}